

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

bool __thiscall
pstore::command_line::
list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
::simple_value(list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
               *this,string *v)

{
  size_t *psVar1;
  int iVar2;
  literal *plVar3;
  bool bVar4;
  long lVar5;
  _List_node_base *p_Var6;
  long lVar7;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  _Var8;
  pointer plVar9;
  
  __it._M_current =
       (this->parser_).super_parser_base.literals_.
       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
       ._M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->parser_).super_parser_base.literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)plVar3 - (long)__it._M_current;
  lVar7 = (lVar5 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar7) {
    plVar9 = __it._M_current + lVar7 * 4;
    lVar7 = lVar7 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)v,__it);
      _Var8._M_current = __it._M_current;
      if (bVar4) goto LAB_001294f4;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)v,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_001294f4;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)v,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_001294f4;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)v,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_001294f4;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
    lVar5 = (long)plVar3 - (long)plVar9;
    __it._M_current = plVar9;
  }
  lVar5 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      if (lVar5 != 3) {
        return false;
      }
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)v,__it);
      _Var8._M_current = __it._M_current;
      if (bVar4) goto LAB_001294f4;
      __it._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
            ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                          *)v,__it);
    _Var8._M_current = __it._M_current;
    if (bVar4) goto LAB_001294f4;
    __it._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
          ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                        *)v,__it);
  _Var8._M_current = __it._M_current;
  if (!bVar4) {
    _Var8._M_current = plVar3;
  }
LAB_001294f4:
  if (_Var8._M_current == plVar3) {
    return false;
  }
  iVar2 = (_Var8._M_current)->value;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var6[1]._M_next = iVar2;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->values_).
            super__List_base<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return true;
}

Assistant:

bool list<T, Parser>::simple_value (std::string const & v) {
            if (maybe<T> m = parser_ (v)) {
                values_.push_back (m.value ());
                return true;
            }
            return false;
        }